

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::AddFrameworkItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  cmGlobalGenerator *this_00;
  undefined8 __args;
  __type _Var1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  string *psVar5;
  ulong uVar6;
  FrameworkDescriptor *pFVar7;
  FrameworkFormat format;
  allocator<char> local_349;
  string local_348;
  FeatureDescriptor *local_328;
  void *local_320;
  void *local_318;
  ItemIsPath local_30c;
  string local_308;
  byte local_2e2;
  allocator<char> local_2e1;
  string local_2e0;
  FeatureDescriptor *local_2c0;
  void *local_2b8;
  void *local_2b0;
  ItemIsPath local_2a8;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  FrameworkDescriptor *local_260;
  string *fw_path;
  string local_250;
  undefined1 local_220 [8];
  ostringstream e;
  undefined1 local_a8 [8];
  optional<cmGlobalGenerator::FrameworkDescriptor> fwDescriptor;
  string *item;
  LinkEntry *entry_local;
  cmComputeLinkInformation *this_local;
  
  this_00 = this->GlobalGenerator;
  fwDescriptor.super__Optional_base<cmGlobalGenerator::FrameworkDescriptor,_false,_false>._M_payload
  .super__Optional_payload<cmGlobalGenerator::FrameworkDescriptor,_true,_false,_false>.
  super__Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>._128_8_ = entry;
  _Var1 = std::operator==(&entry->Feature,(anonymous_namespace)::DEFAULT_abi_cxx11_);
  format = Extended;
  if (_Var1) {
    format = Relaxed;
  }
  cmGlobalGenerator::SplitFrameworkPath
            ((optional<cmGlobalGenerator::FrameworkDescriptor> *)local_a8,this_00,(string *)entry,
             format);
  bVar2 = std::optional::operator_cast_to_bool((optional *)local_a8);
  if (bVar2) {
    local_260 = std::optional<cmGlobalGenerator::FrameworkDescriptor>::operator->
                          ((optional<cmGlobalGenerator::FrameworkDescriptor> *)local_a8);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      AddFrameworkPath(this,&local_260->Directory);
    }
    pFVar7 = std::optional<cmGlobalGenerator::FrameworkDescriptor>::operator->
                       ((optional<cmGlobalGenerator::FrameworkDescriptor> *)local_a8);
    cmGlobalGenerator::FrameworkDescriptor::GetFullPath_abi_cxx11_(&local_280,pFVar7);
    AddLibraryRuntimeInfo(this,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    _Var1 = std::operator==(&entry->Feature,(anonymous_namespace)::DEFAULT_abi_cxx11_);
    if (_Var1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a0,"FRAMEWORK",&local_2a1);
      AddLibraryFeature(this,&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::allocator<char>::~allocator(&local_2a1);
    }
    uVar3 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x29])();
    __args = fwDescriptor.super__Optional_base<cmGlobalGenerator::FrameworkDescriptor,_false,_false>
             ._M_payload.
             super__Optional_payload<cmGlobalGenerator::FrameworkDescriptor,_true,_false,_false>.
             super__Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>._128_8_;
    if ((uVar3 & 1) == 0) {
      pFVar7 = std::optional<cmGlobalGenerator::FrameworkDescriptor>::operator->
                         ((optional<cmGlobalGenerator::FrameworkDescriptor> *)local_a8);
      cmGlobalGenerator::FrameworkDescriptor::GetLinkName_abi_cxx11_(&local_308,pFVar7);
      local_30c = Yes;
      local_318 = (void *)0x0;
      local_320 = (void *)0x0;
      _Var1 = std::operator==(&entry->Feature,(anonymous_namespace)::DEFAULT_abi_cxx11_);
      if (_Var1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_348,"FRAMEWORK",&local_349);
      }
      else {
        std::__cxx11::string::string((string *)&local_348,(string *)&entry->Feature);
      }
      local_328 = FindLibraryFeature(this,&local_348);
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<std::__cxx11::string,cmComputeLinkInformation::ItemIsPath,decltype(nullptr),decltype(nullptr),cmComputeLinkInformation::FeatureDescriptor_const*>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,&local_308,&local_30c,&local_318,&local_320,&local_328);
      std::__cxx11::string::~string((string *)&local_348);
      if (_Var1) {
        std::allocator<char>::~allocator(&local_349);
      }
      std::__cxx11::string::~string((string *)&local_308);
    }
    else {
      local_2a8 = Yes;
      local_2b0 = (void *)0x0;
      local_2b8 = (void *)0x0;
      _Var1 = std::operator==(&entry->Feature,(anonymous_namespace)::DEFAULT_abi_cxx11_);
      local_2e2 = 0;
      if (_Var1) {
        std::allocator<char>::allocator();
        local_2e2 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2e0,"FRAMEWORK",&local_2e1);
      }
      else {
        std::__cxx11::string::string((string *)&local_2e0,(string *)&entry->Feature);
      }
      local_2c0 = FindLibraryFeature(this,&local_2e0);
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<std::__cxx11::string_const&,cmComputeLinkInformation::ItemIsPath,decltype(nullptr),decltype(nullptr),cmComputeLinkInformation::FeatureDescriptor_const*>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args
                 ,&local_2a8,&local_2b0,&local_2b8,&local_2c0);
      std::__cxx11::string::~string((string *)&local_2e0);
      if ((local_2e2 & 1) != 0) {
        std::allocator<char>::~allocator(&local_2e1);
      }
    }
    fw_path._4_4_ = 0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
    poVar4 = std::operator<<((ostream *)local_220,"Could not parse framework path \"");
    poVar4 = std::operator<<(poVar4,(string *)
                                    fwDescriptor.
                                    super__Optional_base<cmGlobalGenerator::FrameworkDescriptor,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<cmGlobalGenerator::FrameworkDescriptor,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>
                                    ._128_8_);
    poVar4 = std::operator<<(poVar4,"\" linked by target ");
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    std::operator<<(poVar4,'.');
    std::__cxx11::ostringstream::str();
    cmSystemTools::Error(&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    fw_path._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
  }
  std::optional<cmGlobalGenerator::FrameworkDescriptor>::~optional
            ((optional<cmGlobalGenerator::FrameworkDescriptor> *)local_a8);
  return;
}

Assistant:

void cmComputeLinkInformation::AddFrameworkItem(LinkEntry const& entry)
{
  std::string const& item = entry.Item.Value;

  // Try to separate the framework name and path.
  auto fwDescriptor = this->GlobalGenerator->SplitFrameworkPath(
    item,
    entry.Feature == DEFAULT ? cmGlobalGenerator::FrameworkFormat::Relaxed
                             : cmGlobalGenerator::FrameworkFormat::Extended);
  if (!fwDescriptor) {
    std::ostringstream e;
    e << "Could not parse framework path \"" << item << "\" linked by target "
      << this->Target->GetName() << '.';
    cmSystemTools::Error(e.str());
    return;
  }

  const std::string& fw_path = fwDescriptor->Directory;
  if (!fw_path.empty()) {
    // Add the directory portion to the framework search path.
    this->AddFrameworkPath(fw_path);
  }

  // add runtime information
  this->AddLibraryRuntimeInfo(fwDescriptor->GetFullPath());

  if (entry.Feature == DEFAULT) {
    // ensure FRAMEWORK feature is loaded
    this->AddLibraryFeature("FRAMEWORK");
  }

  if (this->GlobalGenerator->IsXcode()) {
    // Add framework path - it will be handled by Xcode after it's added to
    // "Link Binary With Libraries" build phase
    this->Items.emplace_back(item, ItemIsPath::Yes, nullptr, nullptr,
                             this->FindLibraryFeature(entry.Feature == DEFAULT
                                                        ? "FRAMEWORK"
                                                        : entry.Feature));
  } else {
    this->Items.emplace_back(
      fwDescriptor->GetLinkName(), ItemIsPath::Yes, nullptr, nullptr,
      this->FindLibraryFeature(entry.Feature == DEFAULT ? "FRAMEWORK"
                                                        : entry.Feature));
  }
}